

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

bool __thiscall Clasp::LoopFormula::otherIsSat(LoopFormula *this,Solver *s)

{
  bool bVar1;
  Literal *pLVar2;
  ulong uVar3;
  LoopFormula *in_RDI;
  Literal *end;
  Literal *it;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  Literal p;
  Literal *local_28;
  bool local_1;
  
  p.rep_ = (uint32)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (in_RDI->other_ == *(uint *)&in_RDI->field_0x10 >> 0x1f) {
    bVar1 = Solver::isTrue((Solver *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),p
                          );
    if (bVar1) {
      local_28 = xBegin(in_RDI);
      pLVar2 = xEnd(in_RDI);
      for (; local_28 != pLVar2; local_28 = local_28 + 1) {
        bVar1 = Solver::isTrue((Solver *)CONCAT44(local_28->rep_,in_stack_ffffffffffffffc8),
                               (Literal)(uint32)((ulong)pLVar2 >> 0x20));
        if (!bVar1) {
          bVar1 = Literal::flagged((Literal *)
                                   ((long)&in_RDI[1].super_Constraint._vptr_Constraint +
                                   (ulong)(*(uint *)&in_RDI->field_0x10 >> 0x1f) * 4));
          if (bVar1) {
            uVar3 = (ulong)(*(uint *)&in_RDI->field_0x10 >> 0x1f);
            *(uint32 *)((long)&in_RDI[1].super_Constraint._vptr_Constraint + uVar3 * 4) =
                 local_28->rep_;
            Literal::flag((Literal *)
                          ((long)&in_RDI[1].super_Constraint._vptr_Constraint + uVar3 * 4));
          }
          else {
            *(uint32 *)
             ((long)&in_RDI[1].super_Constraint._vptr_Constraint +
             (ulong)(*(uint *)&in_RDI->field_0x10 >> 0x1f) * 4) = local_28->rep_;
          }
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = Solver::isTrue((Solver *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                             ,p);
  }
  return local_1;
}

Assistant:

bool LoopFormula::otherIsSat(const Solver& s) {
	if (other_ != xPos_)          { return s.isTrue(lits_[other_]); }
	if (!s.isTrue(lits_[other_])) { return false; }
	for (Literal* it = xBegin(), *end = xEnd(); it != end; ++it) {
		if (!s.isTrue(*it)) {
			if (lits_[xPos_].flagged()){ (lits_[xPos_] = *it).flag(); }
			else                       { lits_[xPos_] = *it; }
			return false;
		}
	}
	return true;
}